

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O3

void __thiscall chrono::ChLinkLockLock::UpdateState(ChLinkLockLock *this)

{
  ChQuaternion<double> *q;
  ChQuaternion<double> *qb;
  ChQuaternion<double> *pCVar1;
  ChQuaternion<double> *qb_00;
  ChQuaternion<double> *pCVar2;
  ChVectorN<double,_7> *__dest;
  double *pdVar3;
  ulong *puVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ChMarker *pCVar47;
  ChBodyFrame *pCVar48;
  ChBodyFrame *pCVar49;
  ChMarker *pCVar50;
  ChFrameMoving<double> *this_00;
  pointer ppCVar51;
  undefined4 uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  double dVar65;
  double dVar66;
  uint uVar67;
  double *pdVar68;
  ulong uVar69;
  uint uVar70;
  long lVar71;
  char *__function;
  Index outer;
  uint uVar72;
  Index outer_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  double dVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  double dVar211;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  DstEvaluatorType dstEvaluator;
  DstEvaluatorType dstEvaluator_1;
  ChMatrix33<double> CqxT;
  ChMatrix33<double> mtemp3;
  SrcEvaluatorType srcEvaluator;
  ChMatrix33<double> m2_Rel_A_dt;
  ChMatrix33<double> m2_Rel_A_dtdt;
  assign_op<double,_double> local_6e0 [16];
  double local_6d0;
  undefined1 local_6c0 [16];
  SrcEvaluatorType *pSStack_6b0;
  undefined1 auStack_6a8 [16];
  type local_698;
  double local_690;
  Matrix<double,_3,_3,_1,_3,_3> *local_688;
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_680;
  RhsNested local_678;
  type local_670;
  undefined8 local_668;
  RhsNested local_660;
  undefined1 local_658 [16];
  type local_648;
  undefined1 local_640 [16];
  SrcEvaluatorType *pSStack_630;
  undefined1 auStack_628 [16];
  type local_618;
  double local_610;
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_608;
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_600;
  RhsNested local_5f8;
  type local_5f0;
  double local_5e8;
  RhsNested local_5e0;
  undefined1 local_5d8 [16];
  type local_5c8;
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  double local_580;
  undefined8 uStack_578;
  double local_570;
  ChQuaternion<double> *local_568;
  ChQuaternion<double> local_560;
  undefined1 local_540 [24];
  undefined1 local_528 [16];
  type local_518;
  undefined8 local_510;
  Matrix<double,_3,_3,_1,_3,_3> *local_508;
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_500;
  RhsNested local_4f8;
  type local_4f0;
  undefined8 local_4e8;
  RhsNested local_4e0;
  undefined1 local_4d8 [16];
  type local_4c8;
  double adStack_4c0 [2];
  undefined1 local_4b0 [88];
  SrcEvaluatorType *local_458;
  assign_op<double,_double> *local_450;
  SrcEvaluatorType *local_448;
  Matrix<double,_3,_4,_0,_3,_4> local_440;
  ChQuaternion<double> local_388;
  undefined8 local_368;
  ulong local_360;
  double adStack_358 [3];
  SrcEvaluatorType local_340;
  Matrix<double,_3,_3,_1,_3,_3> local_270;
  DstXprType local_228;
  undefined1 local_1e0 [48];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [48];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_110 [64];
  double local_d0;
  ChMatrix33<double> local_c0 [2];
  
  pCVar47 = (this->super_ChLinkLock).super_ChLinkMarkers.marker1;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  q = &(this->deltaC).rot;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar99._0_8_ =
       -local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[3];
  auVar99._8_8_ =
       -local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[3];
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar99);
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  auVar99 = *(undefined1 (*) [16])
             (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       -auVar99._0_8_;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -auVar99._8_8_;
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (double)vmovlpd_avx(auVar99);
  local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  pCVar47 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  local_270.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_270.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar77._0_8_ =
       -local_270.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[3];
  auVar77._8_8_ = 0x8000000000000000;
  local_270.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar77);
  local_270.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  auVar99 = *(undefined1 (*) [16])
             (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data;
  local_270.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  local_270.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       -auVar99._0_8_;
  local_270.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -auVar99._8_8_;
  local_270.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (double)vmovlpd_avx(auVar99);
  local_270.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  pCVar48 = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1;
  dVar154 = (pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  dVar5 = (pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  auVar73._0_8_ = dVar154 + dVar154;
  auVar73._8_8_ = dVar5 + dVar5;
  local_180._32_8_ = -auVar73._0_8_;
  local_180._40_8_ = -auVar73._8_8_;
  local_180._24_8_ = vmovlpd_avx(local_180._32_16_);
  dVar154 = (pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  dVar5 = (pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  local_150._0_8_ = dVar154 + dVar154;
  local_150._8_8_ = dVar5 + dVar5;
  auVar99 = vshufpd_avx(local_150,local_150,1);
  local_140 = vshufpd_avx(local_180._32_16_,auVar73,1);
  auVar137._0_8_ = auVar99._0_8_ ^ 0x8000000000000000;
  auVar137._8_8_ = auVar99._8_8_ ^ 0x8000000000000000;
  local_180._0_8_ = vmovlpd_avx(auVar137);
  local_130 = vunpcklpd_avx(auVar137,local_150);
  pCVar48 = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2;
  dVar154 = (pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  dVar5 = (pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  auVar74._0_8_ = dVar154 + dVar154;
  auVar74._8_8_ = dVar5 + dVar5;
  local_1e0._32_8_ = -auVar74._0_8_;
  local_1e0._40_8_ = -auVar74._8_8_;
  local_1e0._24_8_ = vmovlpd_avx(local_1e0._32_16_);
  dVar154 = (pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  dVar5 = (pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  local_1b0._0_8_ = dVar154 + dVar154;
  local_1b0._8_8_ = dVar5 + dVar5;
  auVar99 = vshufpd_avx(local_1b0,local_1b0,1);
  local_1a0 = vshufpd_avx(local_1e0._32_16_,auVar74,1);
  auVar75._0_8_ = auVar99._0_8_ ^ 0x8000000000000000;
  auVar75._8_8_ = auVar99._8_8_ ^ 0x8000000000000000;
  local_1e0._0_8_ = vmovlpd_avx(auVar75);
  local_190 = vunpcklpd_avx(auVar75,local_1b0);
  dVar154 = (this->super_ChLinkLock).super_ChLinkMarkers.relM.pos.m_data[2];
  dVar5 = (this->deltaC).pos.m_data[2];
  auVar99 = vsubpd_avx(*(undefined1 (*) [16])
                        (this->super_ChLinkLock).super_ChLinkMarkers.relM.pos.m_data,
                       *(undefined1 (*) [16])(this->deltaC).pos.m_data);
  *(undefined1 (*) [16])(this->relC).pos.m_data = auVar99;
  (this->relC).pos.m_data[2] = dVar154 - dVar5;
  local_1e0._8_8_ = local_1b0._0_8_;
  local_1e0._16_8_ = auVar74._8_8_;
  local_180._8_8_ = local_150._0_8_;
  local_180._16_8_ = auVar73._8_8_;
  Qconjugate(q);
  qb = &(this->super_ChLinkLock).super_ChLinkMarkers.relM.rot;
  Qcross((ChQuaternion<double> *)&local_440,qb);
  pCVar1 = &(this->relC).rot;
  if (&local_340 != (SrcEvaluatorType *)pCVar1) {
    pCVar1->m_data[0] =
         local_340.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0];
    (this->relC).rot.m_data[1] =
         local_340.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [1];
    (this->relC).rot.m_data[2] =
         local_340.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [2];
    (this->relC).rot.m_data[3] =
         local_340.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [3];
  }
  dVar154 = (this->super_ChLinkLock).super_ChLinkMarkers.relM_dt.pos.m_data[2];
  pCVar1 = &(this->deltaC_dt).rot;
  dVar5 = (this->deltaC_dt).pos.m_data[2];
  auVar99 = vsubpd_avx(*(undefined1 (*) [16])
                        (this->super_ChLinkLock).super_ChLinkMarkers.relM_dt.pos.m_data,
                       *(undefined1 (*) [16])(this->deltaC_dt).pos.m_data);
  *(undefined1 (*) [16])(this->relC_dt).pos.m_data = auVar99;
  (this->relC_dt).pos.m_data[2] = dVar154 - dVar5;
  Qconjugate(pCVar1);
  Qcross((ChQuaternion<double> *)local_6c0,qb);
  Qconjugate(q);
  qb_00 = &(this->super_ChLinkLock).super_ChLinkMarkers.relM_dt.rot;
  Qcross((ChQuaternion<double> *)local_540,qb_00);
  Qadd((ChQuaternion<double> *)&local_440,(ChQuaternion<double> *)local_640);
  pCVar2 = &(this->relC_dt).rot;
  if (&local_340 != (SrcEvaluatorType *)pCVar2) {
    pCVar2->m_data[0] =
         local_340.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0];
    (this->relC_dt).rot.m_data[1] =
         local_340.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [1];
    (this->relC_dt).rot.m_data[2] =
         local_340.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [2];
    (this->relC_dt).rot.m_data[3] =
         local_340.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [3];
  }
  dVar154 = (this->super_ChLinkLock).super_ChLinkMarkers.relM_dtdt.pos.m_data[2];
  local_568 = &(this->deltaC_dtdt).rot;
  dVar5 = (this->deltaC_dtdt).pos.m_data[2];
  auVar99 = vsubpd_avx(*(undefined1 (*) [16])
                        (this->super_ChLinkLock).super_ChLinkMarkers.relM_dtdt.pos.m_data,
                       *(undefined1 (*) [16])(this->deltaC_dtdt).pos.m_data);
  *(undefined1 (*) [16])(this->relC_dtdt).pos.m_data = auVar99;
  (this->relC_dtdt).pos.m_data[2] = dVar154 - dVar5;
  Qconjugate(local_568);
  Qcross((ChQuaternion<double> *)local_640,qb);
  Qconjugate(q);
  Qcross((ChQuaternion<double> *)local_110,
         &(this->super_ChLinkLock).super_ChLinkMarkers.relM_dtdt.rot);
  Qadd((ChQuaternion<double> *)local_6c0,(ChQuaternion<double> *)local_540);
  Qconjugate(pCVar1);
  Qcross(&local_388,qb_00);
  Qscale((ChQuaternion<double> *)local_c0,(ChQuaternion<double> *)local_4b0,2.0);
  Qadd((ChQuaternion<double> *)&local_440,(ChQuaternion<double> *)local_c0);
  pCVar2 = &(this->relC_dtdt).rot;
  if (&local_340 != (SrcEvaluatorType *)pCVar2) {
    pCVar2->m_data[0] =
         local_340.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0];
    (this->relC_dtdt).rot.m_data[1] =
         local_340.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [1];
    (this->relC_dtdt).rot.m_data[2] =
         local_340.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [2];
    (this->relC_dtdt).rot.m_data[3] =
         local_340.
         super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [3];
  }
  ChFrameMoving<double>::Compute_Adt
            (&((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>,
             (ChMatrix33<double> *)local_110);
  ChFrameMoving<double>::Compute_Adtdt
            (&((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>,
             local_c0);
  pCVar48 = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2;
  pCVar47 = (this->super_ChLinkLock).super_ChLinkMarkers.marker1;
  pCVar49 = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1;
  dVar154 = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[1];
  auVar175._8_8_ = 0;
  auVar175._0_8_ = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[0];
  auVar138._8_8_ = 0;
  auVar138._0_8_ = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[2];
  dVar5 = *(double *)
           ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x28);
  dVar6 = *(double *)
           ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x18);
  dVar7 = *(double *)
           ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x20);
  auVar155._8_8_ = 0;
  auVar155._0_8_ =
       *(double *)
        ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar207._8_8_ = 0;
  auVar207._0_8_ =
       (pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar208._8_8_ = 0;
  auVar208._0_8_ =
       *(double *)
        ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  dVar211 = (pCVar47->super_ChFrameMoving<double>).coord_dt.pos.m_data[1];
  auVar212._8_8_ = 0;
  auVar212._0_8_ = dVar211;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = (pCVar47->super_ChFrameMoving<double>).coord_dt.pos.m_data[0];
  auVar122._8_8_ = 0;
  auVar122._0_8_ =
       *(double *)
        ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar200._8_8_ = 0;
  auVar200._0_8_ =
       *(double *)
        ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar209._8_8_ = 0;
  auVar209._0_8_ =
       *(double *)
        ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  pCVar50 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  auVar76._8_8_ = 0;
  auVar76._0_8_ =
       *(double *)
        ((long)&(pCVar49->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar73 = vmulsd_avx512f(auVar212,auVar76);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       *(double *)
        ((long)&(pCVar49->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar74 = vmulsd_avx512f(auVar212,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       *(double *)
        ((long)&(pCVar49->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar213._8_8_ = 0;
  auVar213._0_8_ =
       dVar211 * *(double *)
                  ((long)&(pCVar49->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar99 = vfmadd231sd_fma(auVar213,auVar210,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (pCVar49->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar75 = vfmadd231sd_avx512f(auVar74,auVar210,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       *(double *)
        ((long)&(pCVar49->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar76 = vfmadd231sd_avx512f(auVar73,auVar210,auVar15);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar154 * dVar5;
  auVar73 = vfmadd231sd_fma(auVar78,auVar155,auVar175);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = dVar6 * dVar154;
  auVar74 = vfmadd231sd_fma(auVar100,auVar207,auVar175);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = dVar7 * dVar154;
  auVar77 = vfmadd231sd_fma(auVar188,auVar208,auVar175);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = (pCVar47->super_ChFrameMoving<double>).coord_dt.pos.m_data[2];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       *(double *)
        ((long)&(pCVar49->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar137 = vfmadd231sd_fma(auVar99,auVar176,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       *(double *)
        ((long)&(pCVar49->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar75 = vfmadd231sd_avx512f(auVar75,auVar176,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       *(double *)
        ((long)&(pCVar49->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar76 = vfmadd231sd_avx512f(auVar76,auVar176,auVar18);
  auVar73 = vfmadd231sd_fma(auVar73,auVar122,auVar138);
  auVar99 = vfmadd231sd_fma(auVar77,auVar209,auVar138);
  auVar74 = vfmadd231sd_fma(auVar74,auVar200,auVar138);
  dVar154 = auVar99._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_110._16_8_;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = dVar154 * (double)local_110._40_8_;
  auVar77 = vfmadd231sd_fma(auVar139,auVar74,auVar19);
  auVar189._0_8_ = dVar154 * (double)local_110._24_8_;
  auVar189._8_8_ = dVar154 * (double)local_110._32_8_;
  auVar101._0_8_ = auVar74._0_8_;
  auVar101._8_8_ = auVar101._0_8_;
  auVar99 = vfmadd132pd_fma(auVar101,auVar189,local_110._0_16_);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_d0;
  auVar74 = vfmadd231sd_fma(auVar77,auVar73,auVar20);
  auVar79._0_8_ = auVar73._0_8_;
  auVar79._8_8_ = auVar79._0_8_;
  dVar211 = auVar137._0_8_;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = dVar211 * dVar5;
  auVar73 = vfmadd231sd_avx512f(auVar177,auVar75,auVar155);
  auVar99 = vfmadd132pd_fma(auVar79,auVar99,local_110._48_16_);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = dVar6 * dVar211;
  auVar77 = vfmadd231sd_avx512f(auVar156,auVar75,auVar207);
  auVar73 = vfmadd231sd_avx512f(auVar73,auVar76,auVar122);
  dVar154 = auVar73._0_8_ - (pCVar50->super_ChFrameMoving<double>).coord_dt.pos.m_data[2];
  auVar178._8_8_ = 0;
  auVar178._0_8_ = dVar7 * dVar211;
  auVar73 = vfmadd231sd_avx512f(auVar178,auVar208,auVar75);
  auVar77 = vfmadd231sd_avx512f(auVar77,auVar76,auVar200);
  dVar5 = auVar77._0_8_ - (pCVar50->super_ChFrameMoving<double>).coord_dt.pos.m_data[0];
  auVar73 = vfmadd231sd_avx512f(auVar73,auVar209,auVar76);
  dVar6 = auVar73._0_8_ - (pCVar50->super_ChFrameMoving<double>).coord_dt.pos.m_data[1];
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       *(double *)
        ((long)&(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar157._8_8_ = 0;
  auVar157._0_8_ = dVar5;
  auVar196._8_8_ = 0;
  auVar196._0_8_ =
       dVar6 * *(double *)
                ((long)&(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x28);
  auVar73 = vfmadd231sd_fma(auVar196,auVar157,auVar21);
  auVar158._8_8_ = dVar5;
  auVar158._0_8_ = dVar5;
  auVar102._0_8_ =
       dVar6 * *(double *)
                ((long)&(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x18);
  auVar102._8_8_ =
       dVar6 * *(double *)
                ((long)&(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x20);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       *(double *)
        ((long)&(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar123._8_8_ = 0;
  auVar123._0_8_ = dVar154;
  auVar77 = vfmadd231sd_fma(auVar73,auVar123,auVar22);
  auVar73 = vfmadd132pd_fma(auVar158,auVar102,
                            *(undefined1 (*) [16])
                             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar103._8_8_ = dVar154;
  auVar103._0_8_ = dVar154;
  auVar73 = vfmadd132pd_fma(auVar103,auVar73,
                            *(undefined1 (*) [16])
                             ((long)&(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.
                                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data + 0x30));
  auVar80._0_8_ = auVar99._0_8_ + auVar73._0_8_;
  auVar80._8_8_ = auVar99._8_8_ + auVar73._8_8_;
  auVar99 = vsubpd_avx(auVar80,*(undefined1 (*) [16])(this->deltaC_dt).pos.m_data);
  *(undefined1 (*) [16])(this->super_ChLinkLock).Ct_temp.pos.m_data = auVar99;
  (this->super_ChLinkLock).Ct_temp.pos.m_data[2] =
       (auVar74._0_8_ + auVar77._0_8_) - (this->deltaC_dt).pos.m_data[2];
  Qconjugate(q);
  Qcross((ChQuaternion<double> *)&local_440,&(this->super_ChLinkLock).super_ChLinkMarkers.q_AD);
  Qconjugate(pCVar1);
  Qcross((ChQuaternion<double> *)local_640,qb);
  (this->super_ChLinkLock).Ct_temp.rot.m_data[0] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
       + (double)local_6c0._0_8_;
  (this->super_ChLinkLock).Ct_temp.rot.m_data[1] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
       + (double)local_6c0._8_8_;
  (this->super_ChLinkLock).Ct_temp.rot.m_data[2] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
       + (double)pSStack_6b0;
  (this->super_ChLinkLock).Ct_temp.rot.m_data[3] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
       + (double)auStack_6a8._0_8_;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&(((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>
                ).super_ChFrame<double>.Amatrix;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
                super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_6c0._0_8_ = local_4b0;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0] =
       (double)local_6c0;
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1] =
       (double)&local_340;
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2] =
       (double)local_640;
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3] =
       (double)local_6c0._0_8_;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)&local_440);
  pCVar48 = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2;
  dVar154 = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[1];
  dVar5 = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[0];
  auVar124._8_8_ = dVar5;
  auVar124._0_8_ = dVar5;
  dVar5 = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[2];
  auVar140._8_8_ = dVar5;
  auVar140._0_8_ = dVar5;
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       *(double *)
        ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar104._8_8_ = 0;
  auVar104._0_8_ =
       dVar154 * *(double *)
                  ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar99 = vfmadd231sd_fma(auVar104,auVar124,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       *(double *)
        ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar99 = vfmadd231sd_fma(auVar99,auVar140,auVar24);
  local_388.m_data[0] = 0.0;
  auVar159._0_8_ = -auVar99._0_8_;
  auVar159._8_8_ = auVar99._8_8_ ^ 0x8000000000000000;
  local_388.m_data[1] = (double)vmovlpd_avx(auVar159);
  local_388.m_data[3] = auVar99._0_8_;
  local_368 = 0;
  auVar81._0_8_ =
       dVar154 * *(double *)
                  ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar81._8_8_ =
       dVar154 * *(double *)
                  ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar99 = vfmadd231pd_fma(auVar81,auVar124,
                            *(undefined1 (*) [16])
                             (pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar99 = vfmadd231pd_fma(auVar99,auVar140,
                            *(undefined1 (*) [16])
                             ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.
                                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data + 0x30));
  pdVar68 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array + 2;
  local_388.m_data[2] = (double)vmovhpd_avx(auVar99);
  local_360 = auVar99._0_8_ ^ 0x8000000000000000;
  adStack_358[0] = -auVar99._8_8_;
  adStack_358[1] = (double)vmovlpd_avx(auVar99);
  adStack_358[2] = 0.0;
  lVar71 = 0x10;
  do {
    dVar154 = *(double *)((long)adStack_4c0 + lVar71 + 8);
    ((plain_array<double,_49,_1,_0> *)(pdVar68 + -2))->array[0] =
         *(double *)((long)adStack_4c0 + lVar71);
    pdVar68[-1] = dVar154;
    pdVar3 = (double *)(local_4b0 + lVar71);
    lVar71 = lVar71 + 0x18;
    *pdVar68 = *pdVar3;
    pdVar68 = pdVar68 + 7;
  } while (lVar71 != 0x58);
  pdVar68 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array + 2;
  lVar71 = 0x10;
  do {
    dVar154 = *(double *)((long)adStack_4c0 + lVar71 + 8);
    ((plain_array<double,_49,_1,_0> *)(pdVar68 + -2))->array[0] =
         -*(double *)((long)adStack_4c0 + lVar71);
    pdVar68[-1] = -dVar154;
    puVar4 = (ulong *)(local_4b0 + lVar71);
    lVar71 = lVar71 + 0x18;
    auVar82._0_8_ = *puVar4 ^ 0x8000000000000000;
    auVar82._8_8_ = 0x8000000000000000;
    dVar154 = (double)vmovlpd_avx(auVar82);
    *pdVar68 = dVar154;
    pdVar68 = pdVar68 + 7;
  } while (lVar71 != 0x58);
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3] =
       (double)&local_228;
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[4] =
       (double)local_180;
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2] =
       (double)&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
                super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0] =
       (double)local_4b0;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,4,1,3,4>,1>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,_3,_4,_0,_3,_4> *)&local_340,
             (Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>
              *)&local_440,(assign_op<double,_double> *)local_6c0);
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[3] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[4] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[5] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[6] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[10] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0xb] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0xc] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0xd] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [10];
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x11] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x12] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x13] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
  ;
  (this->super_ChLinkLock).Cq1_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x14] =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xb];
  pCVar47 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
                super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)local_4b0;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       (double)&local_270;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)local_1e0;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,4,1,3,4>,1>,Eigen::internal::assign_op<double,double>>
            (&local_440,
             (Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_4,_1,_3,_4>,_1>
              *)&local_340,(assign_op<double,_double> *)local_6c0);
  dVar7 = (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
          super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dVar211 = *(double *)
             ((long)&(pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             8);
  auVar99 = *(undefined1 (*) [16])
             ((long)&(pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x18);
  auVar73 = *(undefined1 (*) [16])
             ((long)&(pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x30);
  dVar154 = *(double *)
             ((long)&(pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x10);
  dVar5 = *(double *)
           ((long)&(pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x28);
  dVar6 = *(double *)
           ((long)&(pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x40);
  pdVar68 = (double *)
            ((long)&local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data + 0x10);
  lVar71 = 0;
  do {
    dVar8 = local_388.m_data[lVar71];
    dVar9 = local_388.m_data[lVar71 + 3];
    auVar201._8_8_ = dVar9;
    auVar201._0_8_ = dVar9;
    dVar10 = adStack_358[lVar71];
    auVar204._8_8_ = dVar10;
    auVar204._0_8_ = dVar10;
    lVar71 = lVar71 + 1;
    auVar197._0_8_ = dVar7 * dVar8;
    auVar197._8_8_ = dVar211 * dVar8;
    auVar74 = vfmadd231pd_fma(auVar197,auVar99,auVar201);
    auVar74 = vfmadd231pd_fma(auVar74,auVar73,auVar204);
    *(undefined1 (*) [16])((plain_array<double,_16,_0,_64> *)(pdVar68 + -2))->array = auVar74;
    dVar66 = local_340.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[1];
    dVar65 = local_340.
             super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array[0];
    *pdVar68 = dVar154 * dVar8 + dVar10 * dVar6 + dVar9 * dVar5;
    dVar8 = local_340.
            super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[2];
    pdVar68 = pdVar68 + 3;
  } while (lVar71 != 3);
  auVar62._8_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
  ;
  auVar62._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
  ;
  auVar63._8_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
  ;
  auVar63._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
  ;
  lVar71 = 8;
  pdVar68 = (double *)
            ((long)&local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage
                    .m_data + 0x10);
  do {
    dVar154 = local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
              m_data.array[lVar71 + 1];
    dVar5 = local_228.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[lVar71 + 5];
    auVar202._8_8_ = dVar5;
    auVar202._0_8_ = dVar5;
    dVar6 = *(double *)(local_1e0 + lVar71 * 8);
    auVar205._8_8_ = dVar6;
    auVar205._0_8_ = dVar6;
    lVar71 = lVar71 + 1;
    auVar198._0_8_ = dVar65 * dVar154;
    auVar198._8_8_ = dVar66 * dVar154;
    auVar99 = vfmadd231pd_fma(auVar198,auVar62,auVar202);
    auVar99 = vfmadd231pd_fma(auVar99,auVar63,auVar205);
    dVar7 = pdVar68[-1];
    ((plain_array<double,_12,_0,_32> *)(pdVar68 + -2))->array[0] =
         auVar99._0_8_ + ((plain_array<double,_12,_0,_32> *)(pdVar68 + -2))->array[0];
    pdVar68[-1] = auVar99._8_8_ + dVar7;
    *pdVar68 = dVar8 * dVar154 +
               dVar6 * local_340.
                       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                       .m_data.array[8] +
               dVar5 * local_340.
                       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                       .m_data.array[5] + *pdVar68;
    pdVar68 = pdVar68 + 3;
  } while (lVar71 != 0xc);
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[3] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [0];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[4] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [3];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[5] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [6];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[6] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [9];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[10] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [1];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0xb] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [4];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0xc] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [7];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0xd] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [10];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x11] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [2];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x12] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [5];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x13] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [8];
  (this->super_ChLinkLock).Cq2_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.
  m_storage.m_data.array[0x14] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [0xb];
  Qconjugate(&(((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>).
              super_ChFrame<double>.coord.rot);
  Qconjugate(&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross((ChQuaternion<double> *)&local_440,(ChQuaternion<double> *)local_640);
  auVar57._8_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar57._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  auVar160._0_8_ =
       (ulong)local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3] ^ 0x8000000000000000;
  auVar160._8_8_ = 0x8000000000000000;
  local_6c0._8_8_ =
       (ulong)local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[1] ^ 0x8000000000000000;
  pSStack_6b0 = (SrcEvaluatorType *)
                ((ulong)local_340.
                        super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                        .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[2] ^ 0x8000000000000000);
  local_6c0._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auStack_6a8 = vunpcklpd_avx(auVar160,auVar57);
  local_658 = vshufpd_avx(register0x00001280,auVar57,1);
  local_698 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  local_690 = (double)vmovlpd_avx(auVar160);
  local_688 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2];
  pMStack_680 = (Matrix<double,_3,_3,_1,_3,_3> *)
                local_340.
                super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                .array[2];
  local_678 = (RhsNested)
              local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_670 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  local_668 = vmovlpd_avx(register0x00001280);
  local_660 = (RhsNested)
              local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_648 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  pCVar47 = (this->super_ChLinkLock).super_ChLinkMarkers.marker1;
  local_640._0_8_ = (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0]
  ;
  auVar99 = *(undefined1 (*) [16])
             ((pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data + 1);
  pMStack_608 = (Matrix<double,_3,_3,_1,_3,_3> *)
                (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  local_640._8_8_ = auVar99._0_8_ ^ 0x8000000000000000;
  pSStack_630 = (SrcEvaluatorType *)(auVar99._8_8_ ^ 0x8000000000000000);
  local_5f8 = (RhsNested)
              (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  auVar179._0_8_ = -(double)local_5f8;
  auVar179._8_8_ = 0x8000000000000000;
  auStack_628 = vunpcklpd_avx(auVar179,auVar99);
  local_610 = (double)vmovlpd_avx(auVar179);
  auVar99 = vshufps_avx(register0x00001280,register0x00001280,0x4e);
  local_5e8 = (double)vmovlpd_avx(register0x00001280);
  local_5d8._0_8_ = vmovlpd_avx(auVar99);
  local_5d8._8_8_ = (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1]
  ;
  local_5c8 = (type)(pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0]
  ;
  local_618 = (type)local_640._0_8_;
  pMStack_600 = pMStack_608;
  local_5f0 = (type)local_640._0_8_;
  local_5e0 = local_5f8;
  Qconjugate(q);
  auVar58._8_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar58._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0] =
       (double)local_540;
  local_4b0._80_8_ = &local_560;
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[4] =
       (double)&DAT_00000004;
  local_450 = local_6e0;
  lVar71 = 0;
  auVar161._0_8_ =
       (ulong)local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3] ^ 0x8000000000000000;
  auVar161._8_8_ = 0x8000000000000000;
  local_540._8_8_ =
       (ulong)local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[1] ^ 0x8000000000000000;
  local_540._16_8_ =
       (ulong)local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2] ^ 0x8000000000000000;
  local_540._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  local_528 = vunpcklpd_avx(auVar161,auVar58);
  local_4d8 = vshufpd_avx(local_540._8_16_,auVar58,1);
  local_518 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  local_510 = vmovlpd_avx(auVar161);
  local_508 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2];
  pMStack_500 = (Matrix<double,_3,_3,_1,_3,_3> *)
                local_340.
                super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                .array[2];
  local_4f8 = (RhsNested)
              local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_4f0 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  local_4e8 = vmovlpd_avx(local_540._8_16_);
  local_4e0 = (RhsNested)
              local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_4c8 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  local_610 = -local_610;
  pMStack_608 = (Matrix<double,_3,_3,_1,_3,_3> *)-(double)pMStack_608;
  auVar83._0_8_ = -(double)local_5f8;
  auVar83._8_8_ = 0x8000000000000000;
  local_5f8 = (RhsNested)vmovlpd_avx(auVar83);
  auVar84._0_8_ = -local_5e8;
  auVar84._8_8_ = 0x8000000000000000;
  local_5e8 = (double)vmovlpd_avx(auVar84);
  local_5d8._8_8_ = -(double)local_5d8._8_8_;
  local_5d8._0_8_ = -(double)local_5d8._0_8_;
  local_560.m_data[0] = (double)&local_340;
  local_458 = (SrcEvaluatorType *)&local_440;
  local_448 = &local_340;
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1] =
       (double)local_6c0;
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [0];
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3] =
       (double)local_6c0;
  do {
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_4>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)(local_4b0 + 0x50),lVar71);
    lVar71 = lVar71 + 1;
  } while (lVar71 != 4);
  local_560.m_data[0] = (double)&local_440;
  local_4b0._80_8_ = &local_560;
  local_450 = local_6e0;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = 4;
  lVar71 = 0;
  local_458 = &local_340;
  local_448 = (SrcEvaluatorType *)local_560.m_data[0];
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs = (type)local_640;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>)&local_340;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>)local_640;
  do {
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_4>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)(local_4b0 + 0x50),lVar71);
    lVar71 = lVar71 + 1;
  } while (lVar71 != 4);
  pdVar68 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array +
            0x18;
  lVar71 = 0;
  do {
    pdVar3 = (double *)
             ((long)&local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data + lVar71);
    dVar154 = *(double *)
               ((long)&local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                       m_storage.m_data + lVar71 + 8);
    dVar5 = *(double *)
             ((long)&local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data + lVar71 + 0x10);
    dVar6 = *(double *)
             ((long)&local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data + lVar71 + 0x18);
    lVar71 = lVar71 + 0x20;
    *pdVar68 = *pdVar3;
    pdVar68[1] = dVar154;
    pdVar68[2] = dVar5;
    pdVar68[3] = dVar6;
    pdVar68 = pdVar68 + 7;
  } while (lVar71 != 0x80);
  Qconjugate(&(((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>).
              super_ChFrame<double>.coord.rot);
  auVar59._8_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar59._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  local_6c0._8_8_ =
       (ulong)local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[1] ^ 0x8000000000000000;
  pSStack_6b0 = (SrcEvaluatorType *)
                ((ulong)local_340.
                        super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                        .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[2] ^ 0x8000000000000000);
  auVar162._0_8_ =
       (ulong)local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3] ^ 0x8000000000000000;
  auVar162._8_8_ = 0x8000000000000000;
  local_6c0._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auStack_6a8 = vunpcklpd_avx(auVar162,auVar59);
  local_658 = vshufpd_avx(register0x00001280,auVar59,1);
  local_698 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  local_690 = (double)vmovlpd_avx(auVar162);
  local_688 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2];
  pMStack_680 = (Matrix<double,_3,_3,_1,_3,_3> *)
                local_340.
                super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                .array[2];
  local_678 = (RhsNested)
              local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_670 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  local_668 = vmovlpd_avx(register0x00001280);
  local_660 = (RhsNested)
              local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_648 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  Qcross(&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
          super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot,
         &(((this->super_ChLinkLock).super_ChLinkMarkers.marker1)->super_ChFrameMoving<double>).
          super_ChFrame<double>.coord.rot);
  auVar60._8_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar60._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  local_640._8_8_ =
       (ulong)local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[1] ^ 0x8000000000000000;
  pSStack_630 = (SrcEvaluatorType *)
                ((ulong)local_340.
                        super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                        .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[2] ^ 0x8000000000000000);
  auVar163._0_8_ =
       (ulong)local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3] ^ 0x8000000000000000;
  auVar163._8_8_ = 0x8000000000000000;
  local_640._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auStack_628 = vunpcklpd_avx(auVar163,auVar60);
  local_5d8 = vshufpd_avx(register0x00001280,auVar60,1);
  local_618 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  local_610 = (double)vmovlpd_avx(auVar163);
  pMStack_608 = (Matrix<double,_3,_3,_1,_3,_3> *)
                local_340.
                super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                .array[2];
  pMStack_600 = (Matrix<double,_3,_3,_1,_3,_3> *)
                local_340.
                super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                .array[2];
  local_5f8 = (RhsNested)
              local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_5f0 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  local_5e8 = (double)vmovlpd_avx(register0x00001280);
  local_5e0 = (RhsNested)
              local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_5c8 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  Qconjugate(q);
  auVar61._8_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar61._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  lVar71 = 0x18;
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1] =
       (double)local_6c0;
  auVar164._0_8_ =
       (ulong)local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3] ^ 0x8000000000000000;
  auVar164._8_8_ = 0x8000000000000000;
  local_540._8_8_ =
       (ulong)local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[1] ^ 0x8000000000000000;
  local_540._16_8_ =
       (ulong)local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2] ^ 0x8000000000000000;
  local_540._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  local_528 = vunpcklpd_avx(auVar164,auVar61);
  local_4d8 = vshufpd_avx(local_540._8_16_,auVar61,1);
  local_518 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  local_510 = vmovlpd_avx(auVar164);
  local_508 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[2];
  pMStack_500 = (Matrix<double,_3,_3,_1,_3,_3> *)
                local_340.
                super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                .array[2];
  local_4f8 = (RhsNested)
              local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_4f0 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  local_4e8 = vmovlpd_avx(local_540._8_16_);
  local_4e0 = (RhsNested)
              local_340.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array[3];
  local_4c8 = (type)local_340.
                    super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                    m_data.array[0];
  local_610 = -local_610;
  pMStack_608 = (Matrix<double,_3,_3,_1,_3,_3> *)-(double)pMStack_608;
  auVar85._0_8_ = (ulong)local_5f8 ^ 0x8000000000000000;
  auVar85._8_8_ = 0x8000000000000000;
  local_5f8 = (RhsNested)vmovlpd_avx(auVar85);
  auVar86._0_8_ = -local_5e8;
  auVar86._8_8_ = 0x8000000000000000;
  local_5e8 = (double)vmovlpd_avx(auVar86);
  local_5d8._8_8_ = -(double)local_5d8._8_8_;
  local_5d8._0_8_ = -(double)local_5d8._0_8_;
  do {
    uVar69 = *(ulong *)((long)&local_648 + lVar71);
    *(ulong *)(local_658 + lVar71 + 8) = *(ulong *)(local_658 + lVar71 + 8) ^ 0x8000000000000000;
    *(ulong *)((long)&local_648 + lVar71) = uVar69 ^ 0x8000000000000000;
    auVar87._0_8_ = *(ulong *)(local_640 + lVar71) ^ 0x8000000000000000;
    auVar87._8_8_ = 0x8000000000000000;
    uVar11 = vmovlpd_avx(auVar87);
    *(undefined8 *)(local_640 + lVar71) = uVar11;
    lVar71 = lVar71 + 0x20;
  } while (lVar71 != 0x98);
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0] =
       (double)local_540;
  local_458 = (SrcEvaluatorType *)&local_440;
  lVar71 = 0;
  local_4b0._80_8_ = &local_560;
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[4] =
       (double)&DAT_00000004;
  local_450 = local_6e0;
  local_560.m_data[0] = (double)&local_340;
  local_448 = &local_340;
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [0];
  local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [1];
  do {
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_4>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)(local_4b0 + 0x50),lVar71);
    lVar71 = lVar71 + 1;
  } while (lVar71 != 4);
  local_560.m_data[0] = (double)&local_440;
  local_4b0._80_8_ = &local_560;
  local_450 = local_6e0;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = 4;
  lVar71 = 0;
  local_458 = &local_340;
  local_448 = (SrcEvaluatorType *)local_560.m_data[0];
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs = (type)local_640;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>)&local_340;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>)local_640;
  do {
    Eigen::internal::
    copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_4>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)(local_4b0 + 0x50),lVar71);
    lVar71 = lVar71 + 1;
  } while (lVar71 != 4);
  pdVar68 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array +
            0x18;
  lVar71 = 0;
  do {
    pdVar3 = (double *)
             ((long)&local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data + lVar71);
    dVar154 = *(double *)
               ((long)&local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                       m_storage.m_data + lVar71 + 8);
    dVar5 = *(double *)
             ((long)&local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data + lVar71 + 0x10);
    dVar6 = *(double *)
             ((long)&local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data + lVar71 + 0x18);
    lVar71 = lVar71 + 0x20;
    *pdVar68 = *pdVar3;
    pdVar68[1] = dVar154;
    pdVar68[2] = dVar5;
    pdVar68[3] = dVar6;
    pdVar68 = pdVar68 + 7;
  } while (lVar71 != 0x80);
  local_6c0._0_8_ = 0.0;
  stack0xfffffffffffff948 = ZEXT816(0);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = auStack_6a8._8_8_;
  auStack_6a8 = auVar64 << 0x40;
  ChFrameMoving<double>::GetWvel_loc
            (&((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
              super_ChFrameMoving<double>);
  ChFrameMoving<double>::GetWvel_loc
            (&((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
              super_ChFrameMoving<double>);
  pCVar47 = (this->super_ChLinkLock).super_ChLinkMarkers.marker1;
  auVar141._8_8_ = 0;
  auVar141._0_8_ =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [2];
  auVar88._8_8_ = 0;
  auVar88._0_8_ =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [0];
  auVar105._8_8_ = 0;
  auVar105._0_8_ =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [1];
  dVar154 = (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  auVar180._8_8_ = 0;
  auVar180._0_8_ = dVar154;
  dVar5 = (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar125._8_8_ = 0;
  auVar125._0_8_ = dVar5;
  dVar6 = (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  auVar165._8_8_ = 0;
  auVar165._0_8_ = dVar6;
  auVar190._8_8_ = 0;
  auVar190._0_8_ =
       dVar154 * local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[2];
  auVar99 = vfmsub231sd_fma(auVar190,auVar105,auVar125);
  auVar126._8_8_ = 0;
  auVar126._0_8_ =
       dVar5 * local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[0];
  auVar73 = vfmsub231sd_fma(auVar126,auVar165,auVar141);
  auVar166._8_8_ = 0;
  auVar166._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar106._8_8_ = 0;
  auVar106._0_8_ =
       dVar6 * local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[1];
  auVar74 = vfmsub231sd_fma(auVar106,auVar88,auVar180);
  auVar89._8_8_ = 0;
  auVar89._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar142._8_8_ = 0;
  auVar142._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  auVar181._8_8_ = 0;
  auVar181._0_8_ =
       auVar73._0_8_ *
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar77 = vfmsub231sd_fma(auVar181,auVar142,auVar74);
  auVar107._8_8_ = 0;
  auVar107._0_8_ =
       auVar74._0_8_ *
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar74 = vfmsub231sd_fma(auVar107,auVar99,auVar166);
  auVar143._8_8_ = 0;
  auVar143._0_8_ =
       auVar99._0_8_ *
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  auVar99 = vfmsub231sd_fma(auVar143,auVar89,auVar73);
  dVar154 = (pCVar47->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[1];
  dVar5 = (pCVar47->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[0];
  dVar6 = (pCVar47->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[2];
  ChFrameMoving<double>::GetWvel_loc
            (&((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
              super_ChFrameMoving<double>);
  pCVar47 = (this->super_ChLinkLock).super_ChLinkMarkers.marker1;
  auVar144._8_8_ = 0;
  auVar144._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar108._8_8_ = 0;
  auVar108._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  auVar90._8_8_ = 0;
  auVar90._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  dVar7 = (pCVar47->super_ChFrameMoving<double>).coord_dt.pos.m_data[1];
  auVar182._8_8_ = 0;
  auVar182._0_8_ = dVar7;
  dVar211 = (pCVar47->super_ChFrameMoving<double>).coord_dt.pos.m_data[2];
  auVar127._8_8_ = 0;
  auVar127._0_8_ = dVar211;
  dVar8 = (pCVar47->super_ChFrameMoving<double>).coord_dt.pos.m_data[0];
  auVar167._8_8_ = 0;
  auVar167._0_8_ = dVar8;
  auVar191._8_8_ = 0;
  auVar191._0_8_ =
       dVar7 * local_340.
               super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
               array[2];
  auVar73 = vfmsub231sd_fma(auVar191,auVar108,auVar127);
  auVar109._8_8_ = 0;
  auVar109._0_8_ =
       dVar8 * local_340.
               super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
               array[1];
  auVar137 = vfmsub231sd_fma(auVar109,auVar90,auVar182);
  auVar128._8_8_ = 0;
  auVar128._0_8_ =
       dVar211 * local_340.
                 super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                 .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0];
  auVar75 = vfmsub231sd_fma(auVar128,auVar167,auVar144);
  dVar8 = auVar75._0_8_ + auVar75._0_8_ + auVar74._0_8_ + dVar154;
  ChFrameMoving<double>::GetWvel_loc
            (&((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>);
  ChFrameMoving<double>::GetWvel_loc
            (&((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>);
  pCVar47 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  auVar145._8_8_ = 0;
  auVar145._0_8_ =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [2];
  auVar91._8_8_ = 0;
  auVar91._0_8_ =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [0];
  auVar110._8_8_ = 0;
  auVar110._0_8_ =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [1];
  dVar154 = (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  auVar183._8_8_ = 0;
  auVar183._0_8_ = dVar154;
  dVar7 = (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar129._8_8_ = 0;
  auVar129._0_8_ = dVar7;
  dVar211 = (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  auVar168._8_8_ = 0;
  auVar168._0_8_ = dVar211;
  auVar192._8_8_ = 0;
  auVar192._0_8_ =
       dVar154 * local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[2];
  auVar74 = vfmsub231sd_fma(auVar192,auVar110,auVar129);
  auVar130._8_8_ = 0;
  auVar130._0_8_ =
       dVar7 * local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
               m_data.array[0];
  auVar75 = vfmsub231sd_fma(auVar130,auVar168,auVar145);
  auVar169._8_8_ = 0;
  auVar169._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar111._8_8_ = 0;
  auVar111._0_8_ =
       dVar211 * local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[1];
  auVar76 = vfmsub231sd_fma(auVar111,auVar91,auVar183);
  auVar92._8_8_ = 0;
  auVar92._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar146._8_8_ = 0;
  auVar146._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  auVar184._8_8_ = 0;
  auVar184._0_8_ =
       auVar75._0_8_ *
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar12 = vfmsub231sd_fma(auVar184,auVar146,auVar76);
  auVar112._8_8_ = 0;
  auVar112._0_8_ =
       auVar76._0_8_ *
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  auVar76 = vfmsub231sd_fma(auVar112,auVar74,auVar169);
  auVar147._8_8_ = 0;
  auVar147._0_8_ =
       auVar74._0_8_ *
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  auVar74 = vfmsub231sd_fma(auVar147,auVar92,auVar75);
  local_580 = auVar74._0_8_ + (pCVar47->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[2];
  local_5a0._0_8_ = auVar12._0_8_ + (pCVar47->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[0];
  local_590._0_8_ = auVar76._0_8_ + (pCVar47->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[1];
  ChFrameMoving<double>::GetWvel_loc
            (&((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>);
  pCVar47 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  auVar148._8_8_ = 0;
  auVar148._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
  ;
  auVar113._8_8_ = 0;
  auVar113._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
  ;
  auVar93._8_8_ = 0;
  auVar93._0_8_ =
       local_340.
       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
  ;
  this_00 = &((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
             super_ChFrameMoving<double>;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = auVar137._0_8_ + auVar137._0_8_ + auVar99._0_8_ + dVar6;
  dVar154 = (pCVar47->super_ChFrameMoving<double>).coord_dt.pos.m_data[1];
  auVar185._8_8_ = 0;
  auVar185._0_8_ = dVar154;
  dVar6 = (pCVar47->super_ChFrameMoving<double>).coord_dt.pos.m_data[2];
  auVar131._8_8_ = 0;
  auVar131._0_8_ = dVar6;
  dVar7 = (pCVar47->super_ChFrameMoving<double>).coord_dt.pos.m_data[0];
  auVar170._8_8_ = 0;
  auVar170._0_8_ = dVar7;
  pCVar48 = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1;
  auVar193._8_8_ = 0;
  auVar193._0_8_ =
       dVar154 * local_340.
                 super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                 .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[2];
  auVar99 = vfmsub231sd_fma(auVar193,auVar113,auVar131);
  auVar114._8_8_ = 0;
  auVar114._0_8_ =
       dVar7 * local_340.
               super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
               array[1];
  auVar74 = vfmsub231sd_fma(auVar114,auVar93,auVar185);
  auVar132._8_8_ = 0;
  auVar132._0_8_ =
       dVar6 * local_340.
               super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
               array[0];
  auVar137 = vfmsub231sd_fma(auVar132,auVar170,auVar148);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = auVar73._0_8_ + auVar73._0_8_ + auVar77._0_8_ + dVar5;
  dVar154 = auVar99._0_8_ + auVar99._0_8_ + (double)local_5a0._0_8_;
  dVar5 = auVar137._0_8_ + auVar137._0_8_ + (double)local_590._0_8_;
  local_580 = auVar74._0_8_ + auVar74._0_8_ + local_580;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       *(double *)
        ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar171._8_8_ = 0;
  auVar171._0_8_ =
       dVar8 * *(double *)
                ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x20);
  auVar99 = vfmadd231sd_fma(auVar171,auVar186,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar149._8_8_ = 0;
  auVar149._0_8_ =
       dVar8 * *(double *)
                ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 8);
  auVar73 = vfmadd231sd_fma(auVar149,auVar186,auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       *(double *)
        ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar99 = vfmadd231sd_fma(auVar99,auVar199,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       *(double *)
        ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar73 = vfmadd231sd_fma(auVar73,auVar199,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       *(double *)
        ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x18);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar154;
  auVar203._8_8_ = 0;
  auVar203._0_8_ =
       dVar5 * *(double *)
                ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x20);
  auVar74 = vfmadd231sd_fma(auVar203,auVar94,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       *(double *)
        ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar206._8_8_ = 0;
  auVar206._0_8_ =
       dVar8 * *(double *)
                ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x38);
  auVar77 = vfmadd231sd_fma(auVar206,auVar186,auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar194._8_8_ = 0;
  auVar194._0_8_ =
       dVar5 * *(double *)
                ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 8);
  auVar137 = vfmadd231sd_fma(auVar194,auVar94,auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       *(double *)
        ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x30);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar154;
  auVar133._8_8_ = 0;
  auVar133._0_8_ =
       dVar5 * *(double *)
                ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x38);
  auVar75 = vfmadd231sd_fma(auVar133,auVar95,auVar32);
  auVar53._8_8_ = local_4b0._8_8_;
  auVar53._0_8_ = local_4b0._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       *(double *)
        ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x28);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = local_580;
  auVar74 = vfmadd231sd_fma(auVar74,auVar115,auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       *(double *)
        ((long)&(pCVar48->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar77 = vfmadd231sd_fma(auVar77,auVar199,auVar34);
  local_590 = vmovhps_avx(auVar53,local_4b0._24_8_);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       *(double *)
        ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x10);
  auVar137 = vfmadd231sd_fma(auVar137,auVar115,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       *(double *)
        ((long)(this_00->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x40);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = local_580;
  auVar75 = vfmadd231sd_fma(auVar75,auVar116,auVar36);
  auVar54._8_8_ = local_4b0._16_8_;
  auVar54._0_8_ = local_4b0._8_8_;
  local_5a0 = vmovhps_avx(auVar54,local_4b0._32_8_);
  local_580 = auVar99._0_8_ - auVar74._0_8_;
  uStack_578 = 0;
  dVar5 = auVar73._0_8_ - auVar137._0_8_;
  dVar6 = auVar77._0_8_ - auVar75._0_8_;
  auVar55._8_8_ = local_4b0._24_8_;
  auVar55._0_8_ = local_4b0._16_8_;
  auVar99 = vmovhps_avx(auVar55,local_4b0._40_8_);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_4b0._48_8_;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = local_580 * (double)local_4b0._56_8_;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = dVar5;
  auVar73 = vfmadd231sd_fma(auVar172,auVar195,auVar37);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = dVar6;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_4b0._64_8_;
  auVar73 = vfmadd231sd_fma(auVar73,auVar150,auVar38);
  local_570 = auVar73._0_8_;
  ChFrameMoving<double>::GetWvel_loc(this_00);
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       0.0;
  auVar117._0_8_ =
       (ulong)local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
              m_data.array[2] ^ 0x8000000000000000;
  auVar117._8_4_ = 0;
  auVar117._12_4_ = 0x80000000;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       (double)vmovlps_avx(auVar117);
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [2];
  auVar56._8_8_ =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [1];
  auVar56._0_8_ =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [0];
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       0.0;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [1];
  auVar134._0_8_ =
       -local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
        array[0];
  auVar134._8_4_ =
       SUB84(local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
             .array[1],0);
  auVar134._12_4_ =
       (uint)((ulong)local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                     m_storage.m_data.array[1] >> 0x20) ^ 0x80000000;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       auVar134._8_8_;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       (double)vmovlps_avx(auVar56);
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       0.0;
  local_640._0_8_ =
       &(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
        super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_340.
  super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       auVar134._0_8_;
  local_640._8_8_ = &local_340;
  pSStack_630 = &local_340;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((ChMatrix33<double> *)&local_440,
             (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)local_640);
  dVar154 = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[1];
  auVar96._8_8_ = 0;
  auVar96._0_8_ = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[0];
  auVar151._8_8_ = 0;
  auVar151._0_8_ = (this->super_ChLinkLock).super_ChLinkMarkers.PQw.m_data[2];
  pCVar47 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  auVar187._8_8_ = dVar5;
  auVar187._0_8_ = dVar5;
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [1];
  auVar173._8_8_ = 0;
  auVar173._0_8_ =
       dVar154 * local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[4];
  auVar73 = vfmadd231sd_fma(auVar173,auVar96,auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [0];
  auVar135._8_8_ = 0;
  auVar135._0_8_ =
       dVar154 * local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[3];
  auVar74 = vfmadd231sd_fma(auVar135,auVar96,auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [2];
  auVar118._8_8_ = 0;
  auVar118._0_8_ =
       dVar154 * local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
                 m_data.array[5];
  auVar77 = vfmadd231sd_fma(auVar118,auVar96,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [7];
  auVar73 = vfmadd231sd_fma(auVar73,auVar151,auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [6];
  auVar74 = vfmadd231sd_fma(auVar74,auVar151,auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       local_440.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
       [8];
  auVar77 = vfmadd231sd_fma(auVar77,auVar151,auVar44);
  auVar152._0_8_ = local_580 * (double)local_5a0._0_8_;
  auVar152._8_8_ = local_580 * (double)local_5a0._8_8_;
  dVar154 = auVar73._0_8_;
  auVar73 = vfmadd132pd_fma(auVar187,auVar152,local_590);
  auVar153._8_8_ = dVar6;
  auVar153._0_8_ = dVar6;
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       *(double *)
        ((long)&(pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar97._8_8_ = 0;
  auVar97._0_8_ =
       dVar154 * *(double *)
                  ((long)&(pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x28);
  auVar137 = vfmadd231sd_fma(auVar97,auVar74,auVar45);
  auVar99 = vfmadd132pd_fma(auVar153,auVar73,auVar99);
  auVar174._0_8_ =
       dVar154 * *(double *)
                  ((long)&(pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x18);
  auVar174._8_8_ =
       dVar154 * *(double *)
                  ((long)&(pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x20);
  auVar136._0_8_ = auVar74._0_8_;
  auVar136._8_8_ = auVar136._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       *(double *)
        ((long)&(pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar74 = vfmadd231sd_fma(auVar137,auVar77,auVar46);
  auVar119._0_8_ = auVar77._0_8_;
  auVar119._8_8_ = auVar119._0_8_;
  auVar73 = vfmadd132pd_fma(auVar136,auVar174,
                            *(undefined1 (*) [16])
                             (pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar73 = vfmadd132pd_fma(auVar119,auVar73,
                            *(undefined1 (*) [16])
                             ((long)&(pCVar47->super_ChFrameMoving<double>).super_ChFrame<double>.
                                     Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data + 0x30));
  local_6d0 = (auVar74._0_8_ + local_570 +
              (this->super_ChLinkLock).super_ChLinkMarkers.q_4.m_data[2]) -
              (this->deltaC_dtdt).pos.m_data[2];
  auVar120._0_8_ =
       auVar99._0_8_ + auVar73._0_8_ + (this->super_ChLinkLock).super_ChLinkMarkers.q_4.m_data[0];
  auVar120._8_8_ =
       auVar99._8_8_ + auVar73._8_8_ + (this->super_ChLinkLock).super_ChLinkMarkers.q_4.m_data[1];
  local_6e0 = (assign_op<double,_double>  [16])
              vsubpd_avx(auVar120,*(undefined1 (*) [16])(this->deltaC_dtdt).pos.m_data);
  Qconjugate(q);
  Qcross((ChQuaternion<double> *)local_540,&(this->super_ChLinkLock).super_ChLinkMarkers.q_8);
  local_6c0._0_8_ = local_640._0_8_;
  local_6c0._8_8_ = local_640._8_8_;
  pSStack_6b0 = pSStack_630;
  auStack_6a8._0_8_ = auStack_628._0_8_;
  Qconjugate(pCVar1);
  Qcross(&local_560,qb_00);
  Qscale((ChQuaternion<double> *)local_540,(ChQuaternion<double> *)(local_4b0 + 0x50),2.0);
  Qadd((ChQuaternion<double> *)local_6c0,(ChQuaternion<double> *)local_540);
  local_6c0._0_8_ = local_640._0_8_;
  local_6c0._8_8_ = local_640._8_8_;
  pSStack_6b0 = pSStack_630;
  auStack_6a8._0_8_ = auStack_628._0_8_;
  Qconjugate(local_568);
  Qcross((ChQuaternion<double> *)(local_4b0 + 0x50),qb);
  Qadd((ChQuaternion<double> *)local_6c0,(ChQuaternion<double> *)local_540);
  __dest = &(this->super_ChLinkLock).Qc_temp;
  uVar67 = -((uint)((ulong)__dest >> 3) & 0x1fffffff) & 6;
  uVar72 = 3;
  if (uVar67 < 3) {
    uVar72 = uVar67;
  }
  local_6c0._0_8_ = local_640._0_8_;
  pSStack_6b0 = pSStack_630;
  local_6c0._8_8_ = local_640._8_8_;
  auStack_6a8._0_8_ = auStack_628._0_8_;
  if (uVar67 != 0) {
    memcpy(__dest,local_6e0,(ulong)(uVar72 * 8));
  }
  if (uVar72 != 3) {
    uVar69 = (ulong)(uVar72 << 3);
    memcpy((void *)((long)(this->super_ChLinkLock).Qc_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                          m_data.array + uVar69),local_6e0 + uVar69,0x18 - uVar69);
  }
  pdVar68 = (this->super_ChLinkLock).Qc_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array + 3;
  uVar67 = -((uint)((ulong)pdVar68 >> 3) & 0x1fffffff) & 7;
  uVar72 = 4;
  if (uVar67 < 4) {
    uVar72 = uVar67;
  }
  uVar69 = (ulong)(uVar72 << 3);
  memcpy(pdVar68,local_6c0,uVar69);
  if (uVar67 < 4) {
    memcpy((void *)((long)(this->super_ChLinkLock).Qc_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                          m_data.array + uVar69 + 0x18),local_6c0 + uVar69,0x20 - uVar69);
  }
  uVar70 = 0;
  auVar99 = *(undefined1 (*) [16])
             (this->super_ChLinkLock).Qc_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array;
  auVar98._0_8_ = -auVar99._0_8_;
  auVar98._8_4_ = auVar99._8_4_;
  auVar98._12_4_ = auVar99._12_4_ ^ 0x80000000;
  *(undefined1 (*) [16])
   (this->super_ChLinkLock).Qc_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
   m_storage.m_data.array = auVar98;
  uVar72 = *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                           m_data.array + 0x14);
  uVar52 = *(undefined4 *)
            ((this->super_ChLinkLock).Qc_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array + 3
            );
  uVar67 = *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                           m_data.array + 0x1c);
  *(undefined4 *)
   ((this->super_ChLinkLock).Qc_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
    m_storage.m_data.array + 2) =
       *(undefined4 *)
        ((this->super_ChLinkLock).Qc_temp.
         super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array + 2);
  *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
                  array + 0x14) = uVar72 ^ 0x80000000;
  *(undefined4 *)
   ((this->super_ChLinkLock).Qc_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
    m_storage.m_data.array + 3) = uVar52;
  *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
                  array + 0x1c) = uVar67 ^ 0x80000000;
  uVar72 = *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                           m_data.array + 0x24);
  uVar52 = *(undefined4 *)
            ((this->super_ChLinkLock).Qc_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array + 5
            );
  uVar67 = *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                           m_data.array + 0x2c);
  *(undefined4 *)
   ((this->super_ChLinkLock).Qc_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
    m_storage.m_data.array + 4) =
       *(undefined4 *)
        ((this->super_ChLinkLock).Qc_temp.
         super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array + 4);
  *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
                  array + 0x24) = uVar72 ^ 0x80000000;
  *(undefined4 *)
   ((this->super_ChLinkLock).Qc_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
    m_storage.m_data.array + 5) = uVar52;
  *(uint *)((long)(this->super_ChLinkLock).Qc_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.
                  array + 0x2c) = uVar67 ^ 0x80000000;
  auVar121._0_8_ =
       -(this->super_ChLinkLock).Qc_temp.
        super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[6];
  auVar121._8_4_ = 0;
  auVar121._12_4_ = 0x80000000;
  dVar154 = (double)vmovlps_avx(auVar121);
  (this->super_ChLinkLock).Qc_temp.super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
  m_storage.m_data.array[6] = dVar154;
  ppCVar51 = (this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
             super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (((*ppCVar51)->super_ChConstraintTwo).super_ChConstraint.active == true) {
    if (0 < (this->super_ChLinkLock).Cq1.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
      dVar154 = (this->super_ChLinkLock).Cq1_temp.
                super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
                [1];
      (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
      m_storage.m_data.array[0] =
           (this->super_ChLinkLock).Cq1_temp.
           super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[0];
      (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
      m_storage.m_data.array[1] = dVar154;
      dVar154 = (this->super_ChLinkLock).Cq1_temp.
                super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
                [3];
      dVar5 = (this->super_ChLinkLock).Cq1_temp.
              super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[4]
      ;
      dVar6 = (this->super_ChLinkLock).Cq1_temp.
              super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[5]
      ;
      (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
      m_storage.m_data.array[2] =
           (this->super_ChLinkLock).Cq1_temp.
           super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[2];
      (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
      m_storage.m_data.array[3] = dVar154;
      (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
      m_storage.m_data.array[4] = dVar5;
      (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
      m_storage.m_data.array[5] = dVar6;
      (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
      m_storage.m_data.array[6] =
           (this->super_ChLinkLock).Cq1_temp.
           super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[6];
      if (0 < (this->super_ChLinkLock).Cq2.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
        dVar154 = (this->super_ChLinkLock).Cq2_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[1];
        (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[0] =
             (this->super_ChLinkLock).Cq2_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[0];
        (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[1] = dVar154;
        dVar154 = (this->super_ChLinkLock).Cq2_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[3];
        dVar5 = (this->super_ChLinkLock).Cq2_temp.
                super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
                [4];
        dVar6 = (this->super_ChLinkLock).Cq2_temp.
                super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
                [5];
        (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[2] =
             (this->super_ChLinkLock).Cq2_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[2];
        (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[3] = dVar154;
        (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[4] = dVar5;
        (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[5] = dVar6;
        (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[6] =
             (this->super_ChLinkLock).Cq2_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array[6];
        if (((((this->super_ChLinkLock).Qc.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows < 1)
             || ((this->super_ChLinkLock).Qc.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                 array[0] = auVar98._0_8_,
                (this->super_ChLinkLock).C.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows < 1))
            || ((this->super_ChLinkLock).C.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
                [0] = (this->relC).pos.m_data[0],
               (this->super_ChLinkLock).C_dt.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows < 1))
           || (((this->super_ChLinkLock).C_dt.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
                [0] = (this->relC_dt).pos.m_data[0],
               (this->super_ChLinkLock).C_dtdt.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows < 1 ||
               ((this->super_ChLinkLock).C_dtdt.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
                [0] = (this->relC_dtdt).pos.m_data[0],
               (this->super_ChLinkLock).Ct.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows < 1)))
           ) goto LAB_0058d00e;
        uVar70 = 1;
        (this->super_ChLinkLock).Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.
        m_storage.m_data.array[0] = (this->super_ChLinkLock).Ct_temp.pos.m_data[0];
        goto LAB_0058c9d5;
      }
    }
  }
  else {
LAB_0058c9d5:
    if ((ppCVar51[1]->super_ChConstraintTwo).super_ChConstraint.active == true) {
      uVar69 = (ulong)uVar70;
      if ((long)uVar69 <
          (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>
          .m_storage.m_rows) {
        dVar154 = (this->super_ChLinkLock).Cq1_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[8];
        pdVar68 = (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                  array + uVar69 * 7;
        *pdVar68 = (this->super_ChLinkLock).Cq1_temp.
                   super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                   array[7];
        pdVar68[1] = dVar154;
        dVar154 = (this->super_ChLinkLock).Cq1_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[10];
        pdVar68 = (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                  array + uVar69 * 7 + 2;
        *pdVar68 = (this->super_ChLinkLock).Cq1_temp.
                   super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                   array[9];
        pdVar68[1] = dVar154;
        dVar154 = (this->super_ChLinkLock).Cq1_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[0xc];
        pdVar68 = (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                  array + uVar69 * 7 + 4;
        *pdVar68 = (this->super_ChLinkLock).Cq1_temp.
                   super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                   array[0xb];
        pdVar68[1] = dVar154;
        (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[uVar69 * 7 + 6] =
             (this->super_ChLinkLock).Cq1_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
             [0xd];
        if ((long)uVar69 <
            (this->super_ChLinkLock).Cq2.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
          dVar154 = (this->super_ChLinkLock).Cq2_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[8];
          pdVar68 = (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                    array + uVar69 * 7;
          *pdVar68 = (this->super_ChLinkLock).Cq2_temp.
                     super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                     array[7];
          pdVar68[1] = dVar154;
          dVar154 = (this->super_ChLinkLock).Cq2_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[10];
          pdVar68 = (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                    array + uVar69 * 7 + 2;
          *pdVar68 = (this->super_ChLinkLock).Cq2_temp.
                     super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                     array[9];
          pdVar68[1] = dVar154;
          dVar154 = (this->super_ChLinkLock).Cq2_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[0xc];
          pdVar68 = (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                    array + uVar69 * 7 + 4;
          *pdVar68 = (this->super_ChLinkLock).Cq2_temp.
                     super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                     array[0xb];
          pdVar68[1] = dVar154;
          (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>
          .m_storage.m_data.array[uVar69 * 7 + 6] =
               (this->super_ChLinkLock).Cq2_temp.
               super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
               [0xd];
          if ((this->super_ChLinkLock).Qc.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
              (long)uVar69) goto LAB_0058d00e;
          auVar99 = vshufps_avx(auVar98,auVar98,0x4e);
          (this->super_ChLinkLock).Qc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.
          m_storage.m_data.array[uVar69] = auVar99._0_8_;
          if ((((this->super_ChLinkLock).C.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
                (long)uVar69) ||
              ((this->super_ChLinkLock).C.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
               [uVar69] = (this->relC).pos.m_data[1],
              (this->super_ChLinkLock).C_dt.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
              (long)uVar69)) ||
             (((this->super_ChLinkLock).C_dt.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
               [uVar69] = (this->relC_dt).pos.m_data[1],
              (this->super_ChLinkLock).C_dtdt.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
              (long)uVar69 ||
              ((this->super_ChLinkLock).C_dtdt.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
               [uVar69] = (this->relC_dtdt).pos.m_data[1],
              (this->super_ChLinkLock).Ct.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
              (long)uVar69)))) goto LAB_0058d00e;
          uVar70 = uVar70 + 1;
          (this->super_ChLinkLock).Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.
          m_storage.m_data.array[uVar69] = (this->super_ChLinkLock).Ct_temp.pos.m_data[1];
          goto LAB_0058cb20;
        }
      }
    }
    else {
LAB_0058cb20:
      if ((ppCVar51[2]->super_ChConstraintTwo).super_ChConstraint.active != true) {
LAB_0058cc6e:
        if ((ppCVar51[3]->super_ChConstraintTwo).super_ChConstraint.active == true) {
          uVar69 = (ulong)uVar70;
          if ((long)uVar69 <
              (this->super_ChLinkLock).Cq1.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
            dVar154 = (this->super_ChLinkLock).Cq1_temp.
                      super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                      array[0x19];
            dVar5 = (this->super_ChLinkLock).Cq1_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[0x1a];
            dVar6 = (this->super_ChLinkLock).Cq1_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[0x1b];
            pdVar68 = (this->super_ChLinkLock).Cq1.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data
                      .array + uVar69 * 7 + 3;
            *pdVar68 = (this->super_ChLinkLock).Cq1_temp.
                       super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data
                       .array[0x18];
            pdVar68[1] = dVar154;
            pdVar68[2] = dVar5;
            pdVar68[3] = dVar6;
            if ((long)uVar69 <
                (this->super_ChLinkLock).Cq2.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
              dVar154 = (this->super_ChLinkLock).Cq2_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x19];
              dVar5 = (this->super_ChLinkLock).Cq2_temp.
                      super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                      array[0x1a];
              dVar6 = (this->super_ChLinkLock).Cq2_temp.
                      super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                      array[0x1b];
              pdVar68 = (this->super_ChLinkLock).Cq2.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.
                        m_data.array + uVar69 * 7 + 3;
              *pdVar68 = (this->super_ChLinkLock).Cq2_temp.
                         super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                         m_data.array[0x18];
              pdVar68[1] = dVar154;
              pdVar68[2] = dVar5;
              pdVar68[3] = dVar6;
              if ((((this->super_ChLinkLock).Qc.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                    <= (long)uVar69) ||
                  ((this->super_ChLinkLock).Qc.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                   array[uVar69] =
                        (this->super_ChLinkLock).Qc_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                        m_data.array[3],
                  (this->super_ChLinkLock).C.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
                  (long)uVar69)) ||
                 (((this->super_ChLinkLock).C.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                   array[uVar69] = (this->relC).rot.m_data[0],
                  (this->super_ChLinkLock).C_dt.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
                  (long)uVar69 ||
                  (((this->super_ChLinkLock).C_dt.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                    array[uVar69] = (this->relC_dt).rot.m_data[0],
                   (this->super_ChLinkLock).C_dtdt.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
                   (long)uVar69 ||
                   ((this->super_ChLinkLock).C_dtdt.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                    array[uVar69] = (this->relC_dtdt).rot.m_data[0],
                   (this->super_ChLinkLock).Ct.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
                   (long)uVar69)))))) goto LAB_0058d00e;
              uVar70 = uVar70 + 1;
              (this->super_ChLinkLock).Ct.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
              [uVar69] = (this->super_ChLinkLock).Ct_temp.rot.m_data[0];
              goto LAB_0058cd56;
            }
          }
        }
        else {
LAB_0058cd56:
          if ((ppCVar51[4]->super_ChConstraintTwo).super_ChConstraint.active == true) {
            uVar69 = (ulong)uVar70;
            if ((long)uVar69 <
                (this->super_ChLinkLock).Cq1.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
              dVar154 = (this->super_ChLinkLock).Cq1_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x20];
              dVar5 = (this->super_ChLinkLock).Cq1_temp.
                      super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                      array[0x21];
              dVar6 = (this->super_ChLinkLock).Cq1_temp.
                      super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                      array[0x22];
              pdVar68 = (this->super_ChLinkLock).Cq1.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.
                        m_data.array + uVar69 * 7 + 3;
              *pdVar68 = (this->super_ChLinkLock).Cq1_temp.
                         super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                         m_data.array[0x1f];
              pdVar68[1] = dVar154;
              pdVar68[2] = dVar5;
              pdVar68[3] = dVar6;
              if ((long)uVar69 <
                  (this->super_ChLinkLock).Cq2.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
                dVar154 = (this->super_ChLinkLock).Cq2_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                          m_data.array[0x20];
                dVar5 = (this->super_ChLinkLock).Cq2_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x21];
                dVar6 = (this->super_ChLinkLock).Cq2_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x22];
                pdVar68 = (this->super_ChLinkLock).Cq2.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.
                          m_data.array + uVar69 * 7 + 3;
                *pdVar68 = (this->super_ChLinkLock).Cq2_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                           m_data.array[0x1f];
                pdVar68[1] = dVar154;
                pdVar68[2] = dVar5;
                pdVar68[3] = dVar6;
                if (((((this->super_ChLinkLock).Qc.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                       m_rows <= (long)uVar69) ||
                     ((this->super_ChLinkLock).Qc.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data
                      .array[uVar69] =
                           (this->super_ChLinkLock).Qc_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                           m_data.array[4],
                     (this->super_ChLinkLock).C.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                     <= (long)uVar69)) ||
                    ((this->super_ChLinkLock).C.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                     array[uVar69] = (this->relC).rot.m_data[1],
                    (this->super_ChLinkLock).C_dt.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                    <= (long)uVar69)) ||
                   (((this->super_ChLinkLock).C_dt.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                     array[uVar69] = (this->relC_dt).rot.m_data[1],
                    (this->super_ChLinkLock).C_dtdt.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                    <= (long)uVar69 ||
                    ((this->super_ChLinkLock).C_dtdt.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                     array[uVar69] = (this->relC_dtdt).rot.m_data[1],
                    (this->super_ChLinkLock).Ct.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                    <= (long)uVar69)))) goto LAB_0058d00e;
                uVar70 = uVar70 + 1;
                (this->super_ChLinkLock).Ct.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
                [uVar69] = (this->super_ChLinkLock).Ct_temp.rot.m_data[1];
                goto LAB_0058ce3e;
              }
            }
          }
          else {
LAB_0058ce3e:
            if ((ppCVar51[5]->super_ChConstraintTwo).super_ChConstraint.active == true) {
              uVar69 = (ulong)uVar70;
              if ((long)uVar69 <
                  (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
                dVar154 = (this->super_ChLinkLock).Cq1_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                          m_data.array[0x27];
                dVar5 = (this->super_ChLinkLock).Cq1_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x28];
                dVar6 = (this->super_ChLinkLock).Cq1_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x29];
                pdVar68 = (this->super_ChLinkLock).Cq1.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.
                          m_data.array + uVar69 * 7 + 3;
                *pdVar68 = (this->super_ChLinkLock).Cq1_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                           m_data.array[0x26];
                pdVar68[1] = dVar154;
                pdVar68[2] = dVar5;
                pdVar68[3] = dVar6;
                if ((long)uVar69 <
                    (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows)
                {
                  dVar154 = (this->super_ChLinkLock).Cq2_temp.
                            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                            m_data.array[0x27];
                  dVar5 = (this->super_ChLinkLock).Cq2_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                          m_data.array[0x28];
                  dVar6 = (this->super_ChLinkLock).Cq2_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                          m_data.array[0x29];
                  pdVar68 = (this->super_ChLinkLock).Cq2.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.
                            m_data.array + uVar69 * 7 + 3;
                  *pdVar68 = (this->super_ChLinkLock).Cq2_temp.
                             super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                             m_data.array[0x26];
                  pdVar68[1] = dVar154;
                  pdVar68[2] = dVar5;
                  pdVar68[3] = dVar6;
                  if ((((this->super_ChLinkLock).Qc.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                        m_rows <= (long)uVar69) ||
                      ((this->super_ChLinkLock).Qc.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                       m_data.array[uVar69] =
                            (this->super_ChLinkLock).Qc_temp.
                            super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                            m_data.array[5],
                      (this->super_ChLinkLock).C.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                      <= (long)uVar69)) ||
                     (((this->super_ChLinkLock).C.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                       m_data.array[uVar69] = (this->relC).rot.m_data[2],
                      (this->super_ChLinkLock).C_dt.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                      <= (long)uVar69 ||
                      (((this->super_ChLinkLock).C_dt.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                        m_data.array[uVar69] = (this->relC_dt).rot.m_data[2],
                       (this->super_ChLinkLock).C_dtdt.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                       m_rows <= (long)uVar69 ||
                       ((this->super_ChLinkLock).C_dtdt.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                        m_data.array[uVar69] = (this->relC_dtdt).rot.m_data[2],
                       (this->super_ChLinkLock).Ct.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                       m_rows <= (long)uVar69)))))) goto LAB_0058d00e;
                  uVar70 = uVar70 + 1;
                  (this->super_ChLinkLock).Ct.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                  array[uVar69] = (this->super_ChLinkLock).Ct_temp.rot.m_data[2];
                  goto LAB_0058cf26;
                }
              }
            }
            else {
LAB_0058cf26:
              if ((ppCVar51[6]->super_ChConstraintTwo).super_ChConstraint.active != true) {
                return;
              }
              uVar69 = (ulong)uVar70;
              if ((long)uVar69 <
                  (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
                dVar154 = (this->super_ChLinkLock).Cq1_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                          m_data.array[0x2e];
                dVar5 = (this->super_ChLinkLock).Cq1_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x2f];
                dVar6 = (this->super_ChLinkLock).Cq1_temp.
                        super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                        m_data.array[0x30];
                pdVar68 = (this->super_ChLinkLock).Cq1.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.
                          m_data.array + uVar69 * 7 + 3;
                *pdVar68 = (this->super_ChLinkLock).Cq1_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                           m_data.array[0x2d];
                pdVar68[1] = dVar154;
                pdVar68[2] = dVar5;
                pdVar68[3] = dVar6;
                if ((long)uVar69 <
                    (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows)
                {
                  dVar154 = (this->super_ChLinkLock).Cq2_temp.
                            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                            m_data.array[0x2e];
                  dVar5 = (this->super_ChLinkLock).Cq2_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                          m_data.array[0x2f];
                  dVar6 = (this->super_ChLinkLock).Cq2_temp.
                          super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                          m_data.array[0x30];
                  pdVar68 = (this->super_ChLinkLock).Cq2.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.
                            m_data.array + uVar69 * 7 + 3;
                  *pdVar68 = (this->super_ChLinkLock).Cq2_temp.
                             super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.
                             m_data.array[0x2d];
                  pdVar68[1] = dVar154;
                  pdVar68[2] = dVar5;
                  pdVar68[3] = dVar6;
                  if (((((long)uVar69 <
                         (this->super_ChLinkLock).Qc.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                         m_rows) &&
                       ((this->super_ChLinkLock).Qc.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                        m_data.array[uVar69] =
                             (this->super_ChLinkLock).Qc_temp.
                             super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                             m_data.array[6],
                       (long)uVar69 <
                       (this->super_ChLinkLock).C.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                       m_rows)) &&
                      ((this->super_ChLinkLock).C.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.
                       m_data.array[uVar69] = (this->relC).rot.m_data[3],
                      (long)uVar69 <
                      (this->super_ChLinkLock).C_dt.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows
                      )) && (((this->super_ChLinkLock).C_dt.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.
                              m_storage.m_data.array[uVar69] = (this->relC_dt).rot.m_data[3],
                             (long)uVar69 <
                             (this->super_ChLinkLock).C_dtdt.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage
                             .m_rows &&
                             ((this->super_ChLinkLock).C_dtdt.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.
                              m_storage.m_data.array[uVar69] = (this->relC_dtdt).rot.m_data[3],
                             (long)uVar69 <
                             (this->super_ChLinkLock).Ct.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage
                             .m_rows)))) {
                    (this->super_ChLinkLock).Ct.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.
                    array[uVar69] = (this->super_ChLinkLock).Ct_temp.rot.m_data[3];
                    return;
                  }
LAB_0058d00e:
                  __assert_fail("index >= 0 && index < size()",
                                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 7, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 7, 1>, Level = 1]"
                               );
                }
              }
            }
          }
        }
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, 7, 1, 7, 7>, 1, 4>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, 7, 1, 7, 7>, BlockRows = 1, BlockCols = 4, InnerPanel = false]"
        ;
        goto LAB_0058d05c;
      }
      uVar69 = (ulong)uVar70;
      if ((long)uVar69 <
          (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>
          .m_storage.m_rows) {
        dVar154 = (this->super_ChLinkLock).Cq1_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[0xf];
        pdVar68 = (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                  array + uVar69 * 7;
        *pdVar68 = (this->super_ChLinkLock).Cq1_temp.
                   super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                   array[0xe];
        pdVar68[1] = dVar154;
        dVar154 = (this->super_ChLinkLock).Cq1_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[0x11];
        pdVar68 = (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                  array + uVar69 * 7 + 2;
        *pdVar68 = (this->super_ChLinkLock).Cq1_temp.
                   super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                   array[0x10];
        pdVar68[1] = dVar154;
        dVar154 = (this->super_ChLinkLock).Cq1_temp.
                  super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                  array[0x13];
        pdVar68 = (this->super_ChLinkLock).Cq1.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                  array + uVar69 * 7 + 4;
        *pdVar68 = (this->super_ChLinkLock).Cq1_temp.
                   super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                   array[0x12];
        pdVar68[1] = dVar154;
        (this->super_ChLinkLock).Cq1.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.
        m_storage.m_data.array[uVar69 * 7 + 6] =
             (this->super_ChLinkLock).Cq1_temp.
             super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
             [0x14];
        if ((long)uVar69 <
            (this->super_ChLinkLock).Cq2.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows) {
          dVar154 = (this->super_ChLinkLock).Cq2_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[0xf];
          pdVar68 = (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                    array + uVar69 * 7;
          *pdVar68 = (this->super_ChLinkLock).Cq2_temp.
                     super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                     array[0xe];
          pdVar68[1] = dVar154;
          dVar154 = (this->super_ChLinkLock).Cq2_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[0x11];
          pdVar68 = (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                    array + uVar69 * 7 + 2;
          *pdVar68 = (this->super_ChLinkLock).Cq2_temp.
                     super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                     array[0x10];
          pdVar68[1] = dVar154;
          dVar154 = (this->super_ChLinkLock).Cq2_temp.
                    super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                    array[0x13];
          pdVar68 = (this->super_ChLinkLock).Cq2.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_data.
                    array + uVar69 * 7 + 4;
          *pdVar68 = (this->super_ChLinkLock).Cq2_temp.
                     super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.
                     array[0x12];
          pdVar68[1] = dVar154;
          (this->super_ChLinkLock).Cq2.super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>
          .m_storage.m_data.array[uVar69 * 7 + 6] =
               (this->super_ChLinkLock).Cq2_temp.
               super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
               [0x14];
          if (((((this->super_ChLinkLock).Qc.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
                 (long)uVar69) ||
               ((this->super_ChLinkLock).Qc.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
                [uVar69] = (this->super_ChLinkLock).Qc_temp.
                           super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.
                           m_data.array[2],
               (this->super_ChLinkLock).C.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
               (long)uVar69)) ||
              ((this->super_ChLinkLock).C.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
               [uVar69] = (this->relC).pos.m_data[2],
              (this->super_ChLinkLock).C_dt.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
              (long)uVar69)) ||
             (((this->super_ChLinkLock).C_dt.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
               [uVar69] = (this->relC_dt).pos.m_data[2],
              (this->super_ChLinkLock).C_dtdt.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
              (long)uVar69 ||
              ((this->super_ChLinkLock).C_dtdt.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_data.array
               [uVar69] = (this->relC_dtdt).pos.m_data[2],
              (this->super_ChLinkLock).Ct.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows <=
              (long)uVar69)))) goto LAB_0058d00e;
          uVar70 = uVar70 + 1;
          (this->super_ChLinkLock).Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.
          m_storage.m_data.array[uVar69] = (this->super_ChLinkLock).Ct_temp.pos.m_data[2];
          goto LAB_0058cc6e;
        }
      }
    }
  }
  __function = 
  "Eigen::Block<Eigen::Matrix<double, -1, 7, 1, 7, 7>, 1, 7>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, 7, 1, 7, 7>, BlockRows = 1, BlockCols = 7, InnerPanel = false]"
  ;
LAB_0058d05c:
  __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
}

Assistant:

void ChLinkLockLock::UpdateState() {
    // ----------- SOME PRECALCULATED VARIABLES, to optimize speed

    ChStarMatrix33<> P1star(marker1->GetCoord().pos);  // [P] star matrix of rel pos of mark1
    ChStarMatrix33<> Q2star(marker2->GetCoord().pos);  // [Q] star matrix of rel pos of mark2

    ChGlMatrix34<> body1Gl(Body1->GetCoord().rot);
    ChGlMatrix34<> body2Gl(Body2->GetCoord().rot);

    // ----------- RELATIVE LINK-LOCK COORDINATES (violations)

    // relC.pos
    relC.pos = Vsub(relM.pos, deltaC.pos);

    // relC.rot
    relC.rot = Qcross(Qconjugate(deltaC.rot), relM.rot);

    // relC_dt.pos
    relC_dt.pos = Vsub(relM_dt.pos, deltaC_dt.pos);

    // relC_dt.rot
    relC_dt.rot = Qadd(Qcross(Qconjugate(deltaC_dt.rot), relM.rot), Qcross(Qconjugate(deltaC.rot), relM_dt.rot));

    // relC_dtdt.pos
    relC_dtdt.pos = Vsub(relM_dtdt.pos, deltaC_dtdt.pos);

    // relC_dtdt.rot
    relC_dtdt.rot =
        Qadd(Qadd(Qcross(Qconjugate(deltaC_dtdt.rot), relM.rot), Qcross(Qconjugate(deltaC.rot), relM_dtdt.rot)),
             Qscale(Qcross(Qconjugate(deltaC_dt.rot), relM_dt.rot), 2));

    // Compute the Cq Ct Qc matrices (temporary, for complete lock constraint)

    ChMatrix33<> m2_Rel_A_dt;
    marker2->Compute_Adt(m2_Rel_A_dt);
    ChMatrix33<> m2_Rel_A_dtdt;
    marker2->Compute_Adtdt(m2_Rel_A_dtdt);

    // ----------- PARTIAL DERIVATIVE Ct OF CONSTRAINT
    Ct_temp.pos =
        m2_Rel_A_dt.transpose() * (Body2->GetA().transpose() * PQw) +
        marker2->GetA().transpose() *
            (Body2->GetA().transpose() * (Body1->GetA() * marker1->GetCoord_dt().pos) - marker2->GetCoord_dt().pos);
    Ct_temp.pos -= deltaC_dt.pos;  // the deltaC contribute

    // deltaC^*(q_AD) + deltaC_dt^*q_pq
    Ct_temp.rot = Qcross(Qconjugate(deltaC.rot), q_AD) + Qcross(Qconjugate(deltaC_dt.rot), relM.rot);

    //------------ COMPLETE JACOBIANS Cq1_temp AND Cq2_temp AND Qc_temp VECTOR.
    // [Cq_temp]= [[CqxT] [CqxR]]     {Qc_temp} ={[Qcx]}
    //            [[ 0  ] [CqrR]]                {[Qcr]}

    //  JACOBIANS Cq1_temp, Cq2_temp:

    ChMatrix33<> CqxT = marker2->GetA().transpose() * Body2->GetA().transpose();  // [CqxT]=[Aq]'[Ao2]'
    ChStarMatrix33<> tmpStar(Body2->GetA().transpose() * PQw);

    Cq1_temp.topLeftCorner<3, 3>() = CqxT;                                              // *- -- Cq1_temp(1-3)  =[Aqo2]
    Cq2_temp.topLeftCorner<3, 3>() = -CqxT;                                             // -- *- Cq2_temp(1-3)  =-[Aqo2]
    Cq1_temp.topRightCorner<3, 4>() = -CqxT * Body1->GetA() * P1star * body1Gl;         // -* -- Cq1_temp(4-7)
    Cq2_temp.topRightCorner<3, 4>() = CqxT * Body2->GetA() * Q2star * body2Gl +         //
                                      marker2->GetA().transpose() * tmpStar * body2Gl;  // -- -* Cq2_temp(4-7)

    {
        ChStarMatrix44<> stempQ1(Qcross(Qconjugate(marker2->GetCoord().rot), Qconjugate(Body2->GetCoord().rot)));
        ChStarMatrix44<> stempQ2(marker1->GetCoord().rot);
        ChStarMatrix44<> stempDC(Qconjugate(deltaC.rot));
        stempQ2.semiTranspose();
        Cq1_temp.bottomRightCorner<4, 4>() = stempDC * stempQ1 * stempQ2;  // =* == Cq1_temp(col 4-7, row 4-7) ... CqrR
    }

    {
        ChStarMatrix44<> stempQ1(Qconjugate(marker2->GetCoord().rot));
        ChStarMatrix44<> stempQ2(Qcross(Body1->GetCoord().rot, marker1->GetCoord().rot));
        ChStarMatrix44<> stempDC(Qconjugate(deltaC.rot));
        stempQ2.semiTranspose();
        stempQ2.semiNegate();
        Cq2_temp.bottomRightCorner<4, 4>() = stempDC * stempQ1 * stempQ2;  // == =* Cq2_temp(col 4-7, row 4-7) ... CqrR
    }

    //--------- COMPLETE Qc VECTOR
    ChVector<> Qcx;
    ChQuaternion<> Qcr;
    ChVector<> vtemp1;
    ChVector<> vtemp2;

    vtemp1 = Vcross(Body1->GetWvel_loc(), Vcross(Body1->GetWvel_loc(), marker1->GetCoord().pos));
    vtemp1 = Vadd(vtemp1, marker1->GetCoord_dtdt().pos);
    vtemp1 = Vadd(vtemp1, Vmul(Vcross(Body1->GetWvel_loc(), marker1->GetCoord_dt().pos), 2));

    vtemp2 = Vcross(Body2->GetWvel_loc(), Vcross(Body2->GetWvel_loc(), marker2->GetCoord().pos));
    vtemp2 = Vadd(vtemp2, marker2->GetCoord_dtdt().pos);
    vtemp2 = Vadd(vtemp2, Vmul(Vcross(Body2->GetWvel_loc(), marker2->GetCoord_dt().pos), 2));

    Qcx = CqxT * (Body1->GetA() * vtemp1 - Body2->GetA() * vtemp2);

    ChStarMatrix33<> mtemp1(Body2->GetWvel_loc());
    ChMatrix33<> mtemp3 = Body2->GetA() * mtemp1 * mtemp1;
    vtemp2 = marker2->GetA().transpose() * (mtemp3.transpose() * PQw);  // [Aq]'[[A2][w2][w2]]'*Qpq,w
    Qcx = Vadd(Qcx, vtemp2);
    Qcx = Vadd(Qcx, q_4);              // [Adtdt]'[A]'q + 2[Adt]'[Adt]'q + 2[Adt]'[A]'qdt + 2[A]'[Adt]'qdt
    Qcx = Vsub(Qcx, deltaC_dtdt.pos);  // ... - deltaC_dtdt

    Qcr = Qcross(Qconjugate(deltaC.rot), q_8);
    Qcr = Qadd(Qcr, Qscale(Qcross(Qconjugate(deltaC_dt.rot), relM_dt.rot), 2));
    Qcr = Qadd(Qcr, Qcross(Qconjugate(deltaC_dtdt.rot), relM.rot));  // = deltaC'*q_8 + 2*deltaC_dt'*q_dt,po +
                                                                     // deltaC_dtdt'*q,po

    Qc_temp.segment(0, 3) = Qcx.eigen();  // * Qc_temp, for all translational coords
    Qc_temp.segment(3, 4) = Qcr.eigen();  // * Qc_temp, for all rotational coords

    // *** NOTE! The definitive  Qc must change sign, to be used in
    // lagrangian equation:    [Cq]*q_dtdt = Qc
    // because until now we have computed it as [Cq]*q_dtdt + "Qc" = 0,
    // but the most used form is the previous, so let's change sign!!
    Qc_temp *= -1;

    // ---------------------
    // Updates Cq1, Cq2, Qc,
    // C, C_dt, C_dtdt, Ct.
    // ---------------------
    int index = 0;

    if (mask.Constr_X().IsActive()) {
        Cq1.block<1, 7>(index, 0) = Cq1_temp.block<1, 7>(0, 0);
        Cq2.block<1, 7>(index, 0) = Cq2_temp.block<1, 7>(0, 0);

        Qc(index) = Qc_temp(0);

        C(index) = relC.pos.x();
        C_dt(index) = relC_dt.pos.x();
        C_dtdt(index) = relC_dtdt.pos.x();

        Ct(index) = Ct_temp.pos.x();

        index++;
    }

    if (mask.Constr_Y().IsActive()) {
        Cq1.block<1, 7>(index, 0) = Cq1_temp.block<1, 7>(1, 0);
        Cq2.block<1, 7>(index, 0) = Cq2_temp.block<1, 7>(1, 0);

        Qc(index) = Qc_temp(1);

        C(index) = relC.pos.y();
        C_dt(index) = relC_dt.pos.y();
        C_dtdt(index) = relC_dtdt.pos.y();

        Ct(index) = Ct_temp.pos.y();

        index++;
    }

    if (mask.Constr_Z().IsActive()) {
        Cq1.block<1, 7>(index, 0) = Cq1_temp.block<1, 7>(2, 0);
        Cq2.block<1, 7>(index, 0) = Cq2_temp.block<1, 7>(2, 0);

        Qc(index) = Qc_temp(2);

        C(index) = relC.pos.z();
        C_dt(index) = relC_dt.pos.z();
        C_dtdt(index) = relC_dtdt.pos.z();

        Ct(index) = Ct_temp.pos.z();

        index++;
    }

    if (mask.Constr_E0().IsActive()) {
        Cq1.block<1, 4>(index, 3) = Cq1_temp.block<1, 4>(3, 3);
        Cq2.block<1, 4>(index, 3) = Cq2_temp.block<1, 4>(3, 3);

        Qc(index) = Qc_temp(3);

        C(index) = relC.rot.e0();
        C_dt(index) = relC_dt.rot.e0();
        C_dtdt(index) = relC_dtdt.rot.e0();

        Ct(index) = Ct_temp.rot.e0();

        index++;
    }

    if (mask.Constr_E1().IsActive()) {
        Cq1.block<1, 4>(index, 3) = Cq1_temp.block<1, 4>(4, 3);
        Cq2.block<1, 4>(index, 3) = Cq2_temp.block<1, 4>(4, 3);

        Qc(index) = Qc_temp(4);

        C(index) = relC.rot.e1();
        C_dt(index) = relC_dt.rot.e1();
        C_dtdt(index) = relC_dtdt.rot.e1();

        Ct(index) = Ct_temp.rot.e1();

        index++;
    }

    if (mask.Constr_E2().IsActive()) {
        Cq1.block<1, 4>(index, 3) = Cq1_temp.block<1, 4>(5, 3);
        Cq2.block<1, 4>(index, 3) = Cq2_temp.block<1, 4>(5, 3);

        Qc(index) = Qc_temp(5);

        C(index) = relC.rot.e2();
        C_dt(index) = relC_dt.rot.e2();
        C_dtdt(index) = relC_dtdt.rot.e2();

        Ct(index) = Ct_temp.rot.e2();

        index++;
    }

    if (mask.Constr_E3().IsActive()) {
        Cq1.block<1, 4>(index, 3) = Cq1_temp.block<1, 4>(6, 3);
        Cq2.block<1, 4>(index, 3) = Cq2_temp.block<1, 4>(6, 3);

        Qc(index) = Qc_temp(6);

        C(index) = relC.rot.e3();
        C_dt(index) = relC_dt.rot.e3();
        C_dtdt(index) = relC_dtdt.rot.e3();

        Ct(index) = Ct_temp.rot.e3();

        index++;
    }
}